

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

char * js_strdup(JSContext *ctx,char *str)

{
  size_t __n;
  char *__dest;
  
  __n = strlen(str);
  __dest = (char *)js_malloc(ctx,__n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,str,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

char *js_strdup(JSContext *ctx, const char *str)
{
    return js_strndup(ctx, str, strlen(str));
}